

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

bool chaiscript::dispatch::detail::
     compare_types_cast<bool,chaiscript::dispatch::Proxy_Function_Base_const&,chaiscript::dispatch::Proxy_Function_Base_const&>
               (_func_bool_Proxy_Function_Base_ptr_Proxy_Function_Base_ptr *param_1,
               Function_Params *params,Type_Conversions_State *t_conversions)

{
  boxed_cast<chaiscript::dispatch::Proxy_Function_Base_const&>(params->m_begin,t_conversions);
  boxed_cast<chaiscript::dispatch::Proxy_Function_Base_const&>(params->m_begin + 1,t_conversions);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }